

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCall_callWithObjectParameterEqualComparison_Test::testBody
          (TEST_MockExpectedCall_callWithObjectParameterEqualComparison_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  uint uVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString SStack_b8;
  SimpleString local_a8;
  TypeForTestingExpectedFunctionCall equalType;
  TypeForTestingExpectedFunctionCall type;
  MockNamedValueComparatorsAndCopiersRepository repository;
  TypeForTestingExpectedFunctionCallComparator comparator;
  MockNamedValue parameter;
  
  comparator.super_MockNamedValueComparator._vptr_MockNamedValueComparator =
       (MockNamedValueComparator)&PTR__MockNamedValueComparator_002c01f8;
  MockNamedValueComparatorsAndCopiersRepository::MockNamedValueComparatorsAndCopiersRepository
            (&repository);
  MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
  SimpleString::SimpleString((SimpleString *)&parameter,"type");
  MockNamedValueComparatorsAndCopiersRepository::installComparator
            (&repository,(SimpleString *)&parameter,&comparator.super_MockNamedValueComparator);
  SimpleString::~SimpleString((SimpleString *)&parameter);
  TypeForTestingExpectedFunctionCall::TypeForTestingExpectedFunctionCall(&type,1);
  TypeForTestingExpectedFunctionCall::TypeForTestingExpectedFunctionCall(&equalType,1);
  SimpleString::SimpleString(&SStack_b8,"name");
  MockNamedValue::MockNamedValue(&parameter,&SStack_b8);
  SimpleString::~SimpleString(&SStack_b8);
  SimpleString::SimpleString(&SStack_b8,"type");
  MockNamedValue::setConstObjectPointer(&parameter,&SStack_b8,&equalType);
  SimpleString::~SimpleString(&SStack_b8);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&SStack_b8,"type");
  SimpleString::SimpleString(&local_a8,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])(pMVar1,&SStack_b8,&local_a8,&type);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&SStack_b8);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  uVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2b])(pMVar1,&parameter);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(uVar2 & 0xff),"CHECK","call->hasInputParameter(parameter)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x182,pTVar4);
  MockNamedValue::~MockNamedValue(&parameter);
  TypeForTestingExpectedFunctionCall::~TypeForTestingExpectedFunctionCall(&equalType);
  TypeForTestingExpectedFunctionCall::~TypeForTestingExpectedFunctionCall(&type);
  MockNamedValueComparatorsAndCopiersRepository::~MockNamedValueComparatorsAndCopiersRepository
            (&repository);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameterEqualComparison)
{
    TypeForTestingExpectedFunctionCallComparator comparator;
    MockNamedValueComparatorsAndCopiersRepository repository;
    MockNamedValue::setDefaultComparatorsAndCopiersRepository(&repository);
    repository.installComparator("type", comparator);

    TypeForTestingExpectedFunctionCall type(1), equalType(1);
    MockNamedValue parameter("name");
    parameter.setConstObjectPointer("type", &equalType);

    call->withParameterOfType("type", "name", &type);
    CHECK(call->hasInputParameter(parameter));
}